

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# jpge.cpp
# Opt level: O1

void __thiscall jpge::jpeg_encoder::emit_markers(jpeg_encoder *this)

{
  emit_marker(this,0xd8);
  emit_jfif_app0(this);
  emit_dqt(this);
  emit_sof(this);
  emit_dhts(this);
  emit_sos(this);
  return;
}

Assistant:

void jpeg_encoder::emit_markers()
	{
		emit_marker(M_SOI);
		emit_jfif_app0();
		emit_dqt();
		emit_sof();
		emit_dhts();
		emit_sos();
	}